

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_list.c
# Opt level: O0

List * check_list_create(void)

{
  List *pLVar1;
  void **ppvVar2;
  List *lp;
  
  pLVar1 = (List *)emalloc(0x18);
  pLVar1->n_elts = 0;
  pLVar1->max_elts = 1;
  ppvVar2 = (void **)emalloc(8);
  pLVar1->data = ppvVar2;
  pLVar1->last = -1;
  pLVar1->current = -1;
  return pLVar1;
}

Assistant:

List *check_list_create(void)
{
    List *lp;

    lp = (List *)emalloc(sizeof(List));
    lp->n_elts = 0;
    lp->max_elts = LINIT;
    lp->data = (void **)emalloc(sizeof(lp->data[0]) * LINIT);
    lp->current = lp->last = -1;
    return lp;
}